

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall IMLE::setParameters(IMLE *this,Param *prm)

{
  allocator local_31;
  string local_30;
  
  if ((prm->d == this->d) && (prm->D == this->D)) {
    Param::operator=(&this->param,prm);
    set_internal_parameters(this);
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_30,"IMLE::setParameters: parameter dimensions do not match!!",
             &local_31);
  message(this,&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::setParameters(Param const &prm)
{
#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( prm.d != d || prm.D != D)
    {
        message("IMLE::setParameters: parameter dimensions do not match!!");
        return;
    }
#endif

    param = prm;
    set_internal_parameters();
}